

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# utf-test.cpp
# Opt level: O3

void U_to_u8_test(int line,UTF_US32 *str1,UTF_S8 *str2,bool ok)

{
  size_type sVar1;
  ulong uVar2;
  pointer pcVar3;
  int line_00;
  UTF_US32 *pUVar4;
  long lVar5;
  undefined7 in_register_00000009;
  size_type sVar6;
  byte unaff_BL;
  byte bVar7;
  undefined4 *puVar8;
  long lVar9;
  byte *pbVar10;
  ulong uVar11;
  long lVar12;
  ulong in_R9;
  byte bVar13;
  uint uVar14;
  byte bVar15;
  byte bVar16;
  bool bVar17;
  UTF_US8 tmp;
  UTF_UC8 buf [256];
  undefined4 local_178;
  int local_174;
  basic_string<unsigned_char,_std::char_traits<unsigned_char>,_std::allocator<unsigned_char>_>
  local_170;
  UTF_US32 *local_150;
  UTF_S8 *local_148;
  pointer local_140;
  byte local_138 [255];
  byte abStack_39 [9];
  
  puVar8 = &local_178;
  local_178 = (undefined4)CONCAT71(in_register_00000009,ok);
  local_170._M_dataplus._M_p = (pointer)&local_170.field_2;
  local_170._M_string_length = 0;
  local_170.field_2._M_local_buf[0] = '\0';
  sVar1 = str1->_M_string_length;
  local_174 = line;
  local_150 = str1;
  local_148 = str2;
  if (sVar1 != 0) {
    local_140 = (str1->_M_dataplus)._M_p;
    lVar9 = 0;
    do {
      uVar14 = *(uint *)((long)local_140 + lVar9);
      bVar15 = 0x3f;
      if ((uVar14 < 0x110000) && (bVar15 = (byte)uVar14, 0x7f < uVar14)) {
        if (uVar14 < 0x800) {
          bVar13 = (byte)(uVar14 >> 6) | 0xc0;
          bVar7 = 0;
          bVar15 = unaff_BL;
        }
        else {
          if (uVar14 < 0x10000) {
            bVar13 = (byte)(uVar14 >> 0xc) | 0xe0;
            bVar16 = 0;
            uVar14 = uVar14 >> 6;
            bVar7 = bVar15;
          }
          else {
            bVar13 = (byte)(uVar14 >> 0x12) | 0xf0;
            bVar7 = (byte)(uVar14 >> 6);
            bVar16 = bVar15 & 0x3f | 0x80;
            uVar14 = uVar14 >> 0xc;
          }
          bVar7 = bVar7 & 0x3f | 0x80;
          bVar15 = bVar16;
        }
        std::__cxx11::
        basic_string<unsigned_char,_std::char_traits<unsigned_char>,_std::allocator<unsigned_char>_>
        ::push_back(&local_170,bVar13);
        std::__cxx11::
        basic_string<unsigned_char,_std::char_traits<unsigned_char>,_std::allocator<unsigned_char>_>
        ::push_back(&local_170,(byte)uVar14 & 0x3f | 0x80);
        if (bVar7 != 0) {
          std::__cxx11::
          basic_string<unsigned_char,_std::char_traits<unsigned_char>,_std::allocator<unsigned_char>_>
          ::push_back(&local_170,bVar7);
          unaff_BL = bVar15;
          if (bVar15 != 0) goto LAB_001020f9;
          bVar15 = 0;
        }
      }
      else {
LAB_001020f9:
        std::__cxx11::
        basic_string<unsigned_char,_std::char_traits<unsigned_char>,_std::allocator<unsigned_char>_>
        ::push_back(&local_170,bVar15);
        bVar15 = unaff_BL;
      }
      lVar9 = lVar9 + 4;
      unaff_BL = bVar15;
    } while (sVar1 << 2 != lVar9);
  }
  line_00 = local_174;
  UTF_test(local_174,local_178._0_1_);
  pUVar4 = local_150;
  uVar2 = local_148->_M_string_length;
  sVar6 = local_170._M_string_length;
  if (uVar2 < local_170._M_string_length) {
    sVar6 = uVar2;
  }
  if (sVar6 != 0) {
    uVar11 = 0;
    do {
      bVar15 = (local_148->_M_dataplus)._M_p[uVar11];
      in_R9 = (ulong)bVar15;
      if (bVar15 != local_170._M_dataplus._M_p[uVar11]) {
        bVar17 = false;
        goto LAB_0010217b;
      }
      uVar11 = uVar11 + 1;
    } while (sVar6 != uVar11);
  }
  bVar17 = local_170._M_string_length == uVar2;
LAB_0010217b:
  UTF_test(line_00,bVar17);
  sVar1 = pUVar4->_M_string_length;
  bVar17 = true;
  if (sVar1 == 0) {
    pbVar10 = local_138;
  }
  else {
    pcVar3 = (pUVar4->_M_dataplus)._M_p;
    pbVar10 = local_138;
    lVar9 = 0;
    lVar12 = 0;
    do {
      uVar14 = *(uint *)((long)pcVar3 + lVar9);
      if (0x10ffff < uVar14) {
        if (lVar12 != 0xff) {
          *pbVar10 = 0x3f;
          lVar5 = lVar12 + 1;
          goto LAB_001021e7;
        }
LAB_001022f6:
        bVar17 = false;
        break;
      }
      bVar15 = (byte)uVar14;
      if (uVar14 < 0x80) {
        if (lVar12 != 0xff) {
          *pbVar10 = bVar15;
          lVar5 = lVar12 + 1;
          goto LAB_001021e7;
        }
        goto LAB_001022f6;
      }
      if (uVar14 < 0x800) {
        bVar13 = (byte)(uVar14 >> 6) | 0xc0;
        bVar15 = 0;
      }
      else {
        if (uVar14 < 0x10000) {
          bVar13 = (byte)(uVar14 >> 0xc) | 0xe0;
          in_R9 = 0;
          uVar14 = uVar14 >> 6;
          bVar7 = bVar15;
        }
        else {
          bVar13 = (byte)(uVar14 >> 0x12) | 0xf0;
          bVar7 = (byte)(uVar14 >> 6);
          in_R9 = (ulong)(bVar15 & 0x3f | 0x80);
          uVar14 = uVar14 >> 0xc;
        }
        bVar15 = bVar7 & 0x3f | 0x80;
      }
      if (lVar12 == 0xff) goto LAB_001022f6;
      *pbVar10 = bVar13;
      if (lVar12 == 0xfe) {
        pbVar10 = abStack_39;
        goto LAB_001022f6;
      }
      local_138[lVar12 + 1] = (byte)uVar14 & 0x3f | 0x80;
      lVar5 = lVar12 + 2;
      if (bVar15 != 0) {
        if (lVar12 + 2 == 0xff) {
          pbVar10 = local_138 + lVar12 + 2;
          goto LAB_001022f6;
        }
        local_138[lVar12 + 2] = bVar15;
        if ((byte)in_R9 == 0) {
          in_R9 = 0;
          lVar5 = lVar12 + 3;
        }
        else {
          if (lVar12 + 3 == 0xff) {
            pbVar10 = local_138 + lVar12 + 3;
            goto LAB_001022f6;
          }
          local_138[lVar12 + 3] = (byte)in_R9;
          lVar5 = lVar12 + 4;
        }
      }
LAB_001021e7:
      lVar12 = lVar5;
      pbVar10 = local_138 + lVar12;
      lVar9 = lVar9 + 4;
    } while (sVar1 << 2 != lVar9);
  }
  *pbVar10 = 0;
  UTF_test(line_00,bVar17);
  bVar15 = *local_170._M_dataplus._M_p;
  if (bVar15 != 0) {
    lVar9 = 0;
    do {
      lVar12 = lVar9;
      if (local_138[lVar12] == 0) {
        puVar8 = (undefined4 *)((long)&local_178 + lVar12);
        goto LAB_0010235c;
      }
      bVar17 = local_170._M_string_length + 1 == lVar12;
      if ((bVar15 != local_138[lVar12]) || (local_170._M_string_length + 1 == lVar12))
      goto LAB_00102362;
      bVar15 = local_170._M_dataplus._M_p[lVar12 + 1];
      lVar9 = lVar12 + 1;
    } while (bVar15 != 0);
    puVar8 = (undefined4 *)((long)&local_178 + lVar12 + 1);
  }
  bVar15 = 0;
LAB_0010235c:
  bVar17 = bVar15 == *(byte *)((long)puVar8 + 0x40);
LAB_00102362:
  UTF_test(line_00,bVar17);
  if ((anon_union_16_2_edb7204a_for_basic_string<unsigned_char,_std::char_traits<unsigned_char>,_std::allocator<unsigned_char>_>_11
       *)local_170._M_dataplus._M_p != &local_170.field_2) {
    operator_delete(local_170._M_dataplus._M_p);
  }
  return;
}

Assistant:

void U_to_u8_test(int line, const UTF_US32& str1, const UTF_S8& str2, bool ok)
{
    UTF_US8 tmp;
    UTF_UC8 buf[256];
    UTF_test(line, UTF_U_to_u8<'?'>(str1, tmp) == ok);
    UTF_test(line, tmp == reinterpret_cast<const UTF_US8&>(str2));
    UTF_test(line, UTF_uj32_to_uj8(str1.c_str(), str1.size(), buf, 256) == UTF_SUCCESS);
    UTF_test(line, UTF_uj8_cmpn(tmp.c_str(), buf, UTF_SIZE_T(tmp.size() + 1)) == 0);
}